

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O2

mcu8str * mctools_expand_path(mcu8str *__return_storage_ptr__,mcu8str *praw)

{
  char *c_str;
  mcu8str_size_t mVar1;
  mcu8str_size_t prealloc_size;
  ulong uVar2;
  mcu8str p;
  mcu8str local_50;
  mcu8str local_38;
  
  mctools_impl_view_no_winnamespace(&local_38,praw);
  uVar2 = (ulong)local_38.size;
  if (uVar2 == 0) {
    __return_storage_ptr__->c_str = mcu8str_create_empty::dummy;
    __return_storage_ptr__->size = 0;
    __return_storage_ptr__->buflen = 0;
    __return_storage_ptr__->owns_memory = 0;
    return __return_storage_ptr__;
  }
  local_50.owns_memory = 0;
  local_50.size = 0;
  local_50.buflen = 0;
  if ((((local_38.size != 1) && (*local_38.c_str == '~')) &&
      ((local_38.c_str[1] == '\\' || (local_38.c_str[1] == '/')))) &&
     (c_str = getenv("HOME"), c_str != (char *)0x0)) {
    if (local_38.size == 2) {
      mcu8str_create_from_cstr(__return_storage_ptr__,c_str);
      mctools_pathseps_platform(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    mVar1 = mctools_strlen(c_str,0);
    prealloc_size = (uVar2 + mVar1) - 1;
    if ((prealloc_size <= mVar1) || (prealloc_size <= uVar2)) {
      mctools_impl_error("string length overflow in mctools_expand_path");
    }
    mcu8str_create(&local_50,prealloc_size);
    mcu8str_append_cstr(&local_50,c_str);
    mcu8str_append_cstr(&local_50,local_38.c_str + 1);
    if (local_50.size != 0) goto LAB_0010303c;
  }
  mcu8str_copy(&local_50,&local_38);
LAB_0010303c:
  mctools_pathseps_platform(&local_50);
  *(ulong *)&__return_storage_ptr__->owns_memory = CONCAT44(local_50._20_4_,local_50.owns_memory);
  __return_storage_ptr__->c_str = local_50.c_str;
  __return_storage_ptr__->size = local_50.size;
  __return_storage_ptr__->buflen = local_50.buflen;
  return __return_storage_ptr__;
}

Assistant:

mcu8str mctools_expand_path( const mcu8str* praw )
  {
    mcu8str p = mctools_impl_view_no_winnamespace(praw);
    if ( p.size == 0 )
      return mcu8str_create_empty();
    mcu8str res;
    res.owns_memory = 0;
    res.size = 0;
    res.buflen = 0;
#ifdef MC_IS_WINDOWS
    mcwinstr wp = mc_path2longwpath( &p );
    res = mc_winstr_to_u8str(&wp);
    mc_winstr_dealloc(&wp);
#else
    if ( p.size >= 2
         && p.c_str[0] == '~'
         && ( p.c_str[1] == '/' || p.c_str[1] == '\\' ) ) {
      const char * home = getenv("HOME");
      if ( home ) {
        if ( p.size == 2 ) {
          mcu8str rhome = mcu8str_create_from_cstr(home);
          mctools_pathseps_platform(&rhome);
          return rhome;
        }
        const mcu8str_size_t home_size = mctools_strlen( home, 0 );
        const mcu8str_size_t newsize = (mcu8str_size_t)(home_size + p.size - 1);
        if ( ( newsize + 1 != (mcu8str_size_t)(home_size + p.size) )
             || newsize <= home_size || newsize <= p.size )
          mctools_impl_error("string length overflow in mctools_expand_path");
        res = mcu8str_create( newsize );
        mcu8str_append_cstr(&res,home);
        mcu8str_append_cstr(&res, p.c_str + 1 );
      }
    }
    if ( res.size == 0 )
      res = mcu8str_copy( &p );
#endif
    mctools_pathseps_platform(&res);
    return res;
  }